

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int reglevel(FuncState *fs,int nvar)

{
  Vardesc *pVVar1;
  Vardesc *vd;
  int nvar_local;
  FuncState *fs_local;
  
  vd._4_4_ = nvar;
  do {
    if (vd._4_4_ < 1) {
      return 0;
    }
    pVVar1 = getlocalvardesc(fs,vd._4_4_ + -1);
    vd._4_4_ = vd._4_4_ + -1;
  } while ((pVVar1->vd).kind == '\x03');
  return (pVVar1->vd).ridx + 1;
}

Assistant:

static int reglevel (FuncState *fs, int nvar) {
  while (nvar-- > 0) {
    Vardesc *vd = getlocalvardesc(fs, nvar);  /* get previous variable */
    if (vd->vd.kind != RDKCTC)  /* is in a register? */
      return vd->vd.ridx + 1;
  }
  return 0;  /* no variables in registers */
}